

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPool::start(QThreadPool *this,QRunnable *runnable,int priority)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  long in_FS_OFFSET;
  QRunnable *unaff_retaddr;
  QThreadPoolPrivate *in_stack_00000008;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff98;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffa0;
  QRunnable *in_stack_ffffffffffffffb8;
  QThreadPoolPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    d_func((QThreadPool *)0x6cbed5);
    QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar2 = QThreadPoolPrivate::tryStart(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (!bVar2) {
      QThreadPoolPrivate::enqueueTask(in_stack_00000008,unaff_retaddr,priority);
    }
    QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadPool::start(QRunnable *runnable, int priority)
{
    if (!runnable)
        return;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);

    if (!d->tryStart(runnable))
        d->enqueueTask(runnable, priority);
}